

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

path * boost::filesystem::detail::system_complete
                 (path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  path local_40;
  error_code *local_20;
  error_code *ec_local;
  path *p_local;
  
  local_20 = ec;
  ec_local = (error_code *)p;
  p_local = __return_storage_ptr__;
  bVar2 = filesystem::path::empty(p);
  bVar1 = false;
  if ((bVar2) || (bVar2 = filesystem::path::is_absolute((path *)ec_local), bVar2)) {
    filesystem::path::path(__return_storage_ptr__,(path *)ec_local);
  }
  else {
    current_path(&local_40,(error_code *)0x0);
    bVar1 = true;
    operator/(__return_storage_ptr__,&local_40,(path *)ec_local);
  }
  if (bVar1) {
    filesystem::path::~path(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path system_complete(const path& p, system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API
    return (p.empty() || p.is_absolute())
      ? p : current_path()/ p;

#   else
    if (p.empty())
    {
      if (ec != 0) ec->clear();
      return p;
    }
    wchar_t buf[buf_size];
    wchar_t* pfn;
    std::size_t len = get_full_path_name(p, buf_size, buf, &pfn);

    if (error(len == 0 ? BOOST_ERRNO : 0, p, ec, "boost::filesystem::system_complete"))
      return path();

    if (len < buf_size)// len does not include null termination character
      return path(&buf[0]);

    boost::scoped_array<wchar_t> big_buf(new wchar_t[len]);

    return error(get_full_path_name(p, len , big_buf.get(), &pfn)== 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::system_complete")
      ? path()
      : path(big_buf.get());
#   endif
  }